

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::internal::CmpHelperOpFailure<std::__cxx11::string,std::__cxx11::string>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val2,char *op)

{
  AssertionResult *pAVar1;
  string local_98;
  string local_78;
  AssertionResult local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  char *op_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val2_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val1_local;
  char *expr2_local;
  char *expr1_local;
  
  local_38 = val2;
  op_local = (char *)val1;
  val2_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2;
  val1_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr1;
  expr2_local = (char *)this;
  expr1_local = &__return_storage_ptr__->success_;
  testing::AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_48,(char (*) [12])"Expected: (");
  pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])") ");
  pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&local_38);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x11bd63);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&val1_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
  FormatForComparisonFailureMessage<std::__cxx11::string,std::__cxx11::string>
            (&local_78,(internal *)val2_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)op_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_78);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  FormatForComparisonFailureMessage<std::__cxx11::string,std::__cxx11::string>
            (&local_98,(internal *)op_local,val2_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_98);
  testing::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  AssertionResult::~AssertionResult(&local_48);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}